

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O1

void __thiscall
ExprWriterTest_Precedence_Test::~ExprWriterTest_Precedence_Test
          (ExprWriterTest_Precedence_Test *this)

{
  LogicalConstant *this_00;
  
  this_00 = &this[-1].super_ExprWriterTest.l0;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)this);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, Precedence) {
  const std::size_t num_exprs = sizeof(INFO) / sizeof(*INFO);
  EXPECT_EQ(ex::LAST_EXPR + 1u, num_exprs);
  for (std::size_t i = 0; i < num_exprs; ++i)
    EXPECT_EQ(INFO[i].prec, precedence(INFO[i].kind)) << str(INFO[i].kind);
  const prec::Precedence PREC[] = {
    prec::UNKNOWN,
    prec::CONDITIONAL,
    prec::IFF,
    prec::IMPLICATION,
    prec::LOGICAL_OR,
    prec::LOGICAL_AND,
    prec::NOT,
    prec::RELATIONAL,
    prec::ADDITIVE,
    prec::ITERATIVE,
    prec::MULTIPLICATIVE,
    prec::EXPONENTIATION,
    prec::UNARY,
    prec::CALL,
    prec::PRIMARY
  };
  for (std::size_t i = 1, n = sizeof(PREC) / sizeof(*PREC); i < n; ++i)
    EXPECT_EQ(PREC[i - 1] + 1, PREC[i]);
}